

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

string * __thiscall
duckdb::Exception::ConstructMessageRecursive<int,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,int param,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params)

{
  long lVar1;
  long *plVar2;
  undefined4 in_register_00000084;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  ExceptionFormatValue local_60;
  
  plVar2 = (long *)CONCAT44(in_register_00000084,param);
  ExceptionFormatValue::ExceptionFormatValue(&local_60,(long)(int)values);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.str_val._M_dataplus._M_p != &local_60.str_val.field_2) {
    operator_delete(local_60.str_val._M_dataplus._M_p);
  }
  lVar1 = *plVar2;
  local_80[0] = local_70;
  ::std::__cxx11::string::_M_construct<char*>((string *)local_80,lVar1,plVar2[1] + lVar1);
  ConstructMessageRecursive<std::__cxx11::string>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_register_00000084,param));
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}